

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void Net_WriteWeapon(PClassWeapon *type)

{
  uint *puVar1;
  bool local_21;
  int *index_p;
  int index;
  PClassWeapon *type_local;
  
  puVar1 = (uint *)TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::
                   CheckKey(&Weapons_hton,type);
  if (puVar1 == (uint *)0x0) {
    index_p._4_4_ = 0;
  }
  else {
    index_p._4_4_ = *puVar1;
  }
  local_21 = 0x7fff < index_p._4_4_;
  if (local_21) {
    __assert_fail("index >= 0 && index <= 32767",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_weapons.cpp"
                  ,0x725,"void Net_WriteWeapon(PClassWeapon *)");
  }
  if ((int)index_p._4_4_ < 0x80) {
    Net_WriteByte((byte)index_p._4_4_);
  }
  else {
    Net_WriteByte((byte)index_p._4_4_ | 0x80);
    Net_WriteByte((BYTE)((int)index_p._4_4_ >> 7));
  }
  return;
}

Assistant:

void Net_WriteWeapon(PClassWeapon *type)
{
	int index, *index_p;

	index_p = Weapons_hton.CheckKey(type);
	if (index_p == NULL)
	{
		index = 0;
	}
	else
	{
		index = *index_p;
	}
	// 32767 weapons better be enough for anybody.
	assert(index >= 0 && index <= 32767);
	if (index < 128)
	{
		Net_WriteByte(index);
	}
	else
	{
		Net_WriteByte(0x80 | index);
		Net_WriteByte(index >> 7);
	}
}